

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

uint __thiscall
Assimp::glTFExporter::ExportNode(glTFExporter *this,aiNode *n,Ref<glTF::Node> *parent)

{
  Asset *this_00;
  Node *pNVar1;
  bool bVar2;
  vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *pvVar3;
  uint uVar4;
  uint i;
  ulong uVar5;
  uint i_1;
  Ref<glTF::Node> RVar6;
  allocator local_81;
  string local_80;
  Ref<glTF::Node> local_60;
  string local_50;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_50,(n->mName).data,&local_81);
  glTF::Asset::FindUniqueID(&local_80,this_00,&local_50,"node");
  RVar6 = glTF::LazyDict<glTF::Node>::Create(&this_00->nodes,local_80._M_dataplus._M_p);
  pvVar3 = RVar6.vector;
  uVar4 = RVar6.index;
  local_60.vector = pvVar3;
  local_60.index = uVar4;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  pNVar1 = (pvVar3->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar4];
  (pNVar1->parent).index = parent->index;
  (pNVar1->parent).vector = parent->vector;
  bVar2 = aiMatrix4x4t<float>::IsIdentity(&n->mTransformation);
  if (!bVar2) {
    ((pvVar3->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar4]->matrix).isPresent = true;
    CopyValue(&n->mTransformation,
              ((pvVar3->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]->matrix).value);
  }
  for (uVar5 = 0; uVar5 < n->mNumMeshes; uVar5 = uVar5 + 1) {
    local_80._M_string_length._0_4_ = n->mMeshes[uVar5];
    local_80._M_dataplus._M_p =
         (pointer)&(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->meshes).mObjs;
    std::vector<glTF::Ref<glTF::Mesh>,std::allocator<glTF::Ref<glTF::Mesh>>>::
    emplace_back<glTF::Ref<glTF::Mesh>>
              ((vector<glTF::Ref<glTF::Mesh>,std::allocator<glTF::Ref<glTF::Mesh>>> *)
               &(pvVar3->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4]->meshes,(Ref<glTF::Mesh> *)&local_80);
  }
  for (uVar5 = 0; uVar5 < n->mNumChildren; uVar5 = uVar5 + 1) {
    local_80._M_string_length._0_4_ = ExportNode(this,n->mChildren[uVar5],&local_60);
    local_80._M_dataplus._M_p =
         (pointer)&(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->nodes).mObjs;
    std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
    emplace_back<glTF::Ref<glTF::Node>>
              ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
               &(pvVar3->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4]->children,(Ref<glTF::Node> *)&local_80);
  }
  return uVar4;
}

Assistant:

unsigned int glTFExporter::ExportNode(const aiNode* n, Ref<Node>& parent)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    node->parent = parent;

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}